

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_argmax(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  
  pgVar3 = dst->src[0];
  if (pgVar3->type == GGML_TYPE_F32) {
    if (params->ith == 0) {
      uVar2 = (uint)pgVar3->ne[0];
      uVar4 = pgVar3->ne[1];
      sVar5 = pgVar3->nb[1];
      sVar6 = dst->nb[0];
      lVar8 = 0;
      for (uVar9 = 0; uVar9 != (~((long)uVar4 >> 0x3f) & uVar4); uVar9 = uVar9 + 1) {
        auVar12 = SUB6416(ZEXT464(0xff800000),0);
        uVar7 = 0;
        for (uVar10 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar10; uVar10 = uVar10 + 1) {
          fVar1 = *(float *)((long)pgVar3->data + uVar10 * 4 + lVar8);
          auVar12 = vmaxss_avx(auVar12,ZEXT416((uint)fVar1));
          uVar11 = uVar10 & 0xffffffff;
          if (auVar12._0_4_ != fVar1) {
            uVar11 = uVar7;
          }
          if (!NAN(auVar12._0_4_) && !NAN(fVar1)) {
            uVar7 = uVar11;
          }
        }
        lVar8 = lVar8 + sVar5;
        *(int *)((long)dst->data + uVar9 * sVar6) = (int)uVar7;
      }
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x848,"fatal error");
}

Assistant:

void ggml_compute_forward_argmax(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argmax_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}